

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  mbedtls_key_exchange_type_t mVar2;
  uint uVar3;
  uint uVar4;
  mbedtls_ssl_ciphersuite_t *ciphersuite;
  uchar *puVar5;
  mbedtls_ssl_config *pmVar6;
  size_t __n;
  mbedtls_x509_crt *pmVar7;
  int iVar8;
  int iVar9;
  mbedtls_x509_crt *pmVar10;
  mbedtls_x509_crl **ppmVar11;
  ushort uVar12;
  char *pcVar13;
  mbedtls_ssl_session *pmVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  
  ciphersuite = ssl->transform_negotiate->ciphersuite_info;
  uVar1 = *(uint *)&ssl->conf->field_0x174;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x107f,"=> parse certificate");
  mVar2 = ciphersuite->key_exchange;
  if ((mVar2 < (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK|MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) &&
     ((0x960U >> (mVar2 & 0x1f) & 1) != 0)) {
    iVar8 = 0x1086;
LAB_0011521a:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar8,"<= skip parse certificate");
    ssl->state = ssl->state + 1;
    return 0;
  }
  uVar3 = *(uint *)&ssl->conf->field_0x174;
  if (mVar2 == MBEDTLS_KEY_EXCHANGE_RSA_PSK && (uVar3 & 1) != 0) {
    iVar8 = 0x108f;
    goto LAB_0011521a;
  }
  uVar4 = ssl->handshake->sni_authmode;
  uVar1 = uVar1 >> 2 & 3;
  if (uVar4 != 3) {
    uVar1 = uVar4;
  }
  if (((uVar3 & 1) != 0) && (uVar1 == 0)) {
    ssl->session_negotiate->verify_result = 0x80;
    iVar8 = 0x109d;
    goto LAB_0011521a;
  }
  iVar8 = mbedtls_ssl_read_record(ssl);
  if (iVar8 != 0) {
    pcVar13 = "mbedtls_ssl_read_record";
    iVar9 = 0x10a5;
LAB_001152de:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar9,pcVar13,iVar8);
    return iVar8;
  }
  ssl->state = ssl->state + 1;
  uVar3 = *(uint *)&ssl->conf->field_0x174;
  if ((((((uVar3 & 1) != 0) && (ssl->minor_ver != 0)) &&
       (uVar16 = (ulong)((uVar3 & 2) << 2), ssl->in_hslen == uVar16 + 7)) &&
      ((ssl->in_msgtype == 0x16 && (*ssl->in_msg == '\v')))) &&
     (iVar8 = bcmp(ssl->in_msg + (uVar16 | 4),"",3), iVar8 == 0)) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x10cd,"TLSv1 client has no certificate");
    ssl->session_negotiate->verify_result = 0x40;
    if (uVar1 != 1) {
      return -0x7480;
    }
    return 0;
  }
  if (ssl->in_msgtype != 0x16) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x10dc,"bad certificate message");
    return -0x7700;
  }
  puVar5 = ssl->in_msg;
  if (*puVar5 == '\v') {
    uVar16 = (ulong)((uVar3 & 2) << 2);
    if (uVar16 + 10 <= ssl->in_hslen) {
      uVar15 = uVar16 | 4;
      if ((puVar5[uVar15] == '\0') &&
         (ssl->in_hslen ==
          (ushort)(*(ushort *)(puVar5 + uVar15 + 1) << 8 | *(ushort *)(puVar5 + uVar15 + 1) >> 8) +
          uVar15 + 3)) {
        pmVar14 = ssl->session_negotiate;
        if (pmVar14->peer_cert != (mbedtls_x509_crt *)0x0) {
          mbedtls_x509_crt_free(pmVar14->peer_cert);
          free(ssl->session_negotiate->peer_cert);
          pmVar14 = ssl->session_negotiate;
        }
        pmVar10 = (mbedtls_x509_crt *)calloc(1,0x228);
        pmVar14->peer_cert = pmVar10;
        if (pmVar10 == (mbedtls_x509_crt *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x1100,"alloc(%d bytes) failed",0x228);
          return -0x7f00;
        }
        uVar16 = uVar16 | 7;
        mbedtls_x509_crt_init(pmVar10);
        iVar8 = 0;
        do {
          if (ssl->in_hslen <= uVar16) {
            mbedtls_debug_print_crt
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x1125,"peer certificate",ssl->session_negotiate->peer_cert);
            pmVar6 = ssl->conf;
            if (((pmVar6->field_0x174 & 1) == 0) && (ssl->renego_status == 1)) {
              pmVar10 = ssl->session->peer_cert;
              if (pmVar10 == (mbedtls_x509_crt *)0x0) {
                pcVar13 = "new server cert during renegotiation";
                iVar8 = 0x1131;
                goto LAB_001154de;
              }
              __n = (pmVar10->raw).len;
              pmVar7 = ssl->session_negotiate->peer_cert;
              if ((__n != (pmVar7->raw).len) ||
                 (iVar9 = bcmp((pmVar10->raw).p,(pmVar7->raw).p,__n), iVar9 != 0)) {
                pcVar13 = "server cert changed during renegotiation";
                iVar8 = 0x113b;
                goto LAB_001154de;
              }
            }
            if (uVar1 != 0) {
              pmVar10 = ssl->handshake->sni_ca_chain;
              if (pmVar10 == (mbedtls_x509_crt *)0x0) {
                pmVar10 = pmVar6->ca_chain;
                if (pmVar10 == (mbedtls_x509_crt *)0x0) {
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                             ,0x1155,"got no CA chain");
                  return -0x7680;
                }
                ppmVar11 = &pmVar6->ca_crl;
              }
              else {
                ppmVar11 = &ssl->handshake->sni_ca_crl;
              }
              iVar9 = mbedtls_x509_crt_verify_with_profile
                                (ssl->session_negotiate->peer_cert,pmVar10,*ppmVar11,
                                 pmVar6->cert_profile,ssl->hostname,
                                 &ssl->session_negotiate->verify_result,pmVar6->f_vrfy,
                                 pmVar6->p_vrfy);
              if (iVar9 != 0) {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x1166,"x509_verify_cert",iVar9);
              }
              pmVar10 = ssl->session_negotiate->peer_cert;
              iVar8 = mbedtls_pk_can_do(&pmVar10->pk,MBEDTLS_PK_ECKEY);
              if (((iVar8 != 0) &&
                  (iVar8 = mbedtls_ssl_check_curve(ssl,*(pmVar10->pk).pk_ctx), iVar8 != 0)) &&
                 (mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                             ,0x1175,"bad certificate (EC key curve)"), iVar9 == 0)) {
                iVar9 = -0x7a00;
              }
              iVar8 = mbedtls_ssl_check_cert_usage
                                (ssl->session_negotiate->peer_cert,ciphersuite,
                                 ~*(uint *)&ssl->conf->field_0x174 & 1,
                                 &ssl->session_negotiate->verify_result);
              if ((iVar8 != 0) &&
                 (mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                             ,0x1181,"bad certificate (usage extensions)"), iVar9 == 0)) {
                iVar9 = -0x7a00;
              }
              iVar8 = 0;
              if (uVar1 != 1) {
                iVar8 = iVar9;
              }
            }
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x118a,"<= parse certificate");
            return iVar8;
          }
          puVar5 = ssl->in_msg;
          if (puVar5[uVar16] != '\0') {
            pcVar13 = "bad certificate message";
            iVar8 = 0x110c;
            goto LAB_001154de;
          }
          uVar12 = *(ushort *)(puVar5 + uVar16 + 1) << 8 | *(ushort *)(puVar5 + uVar16 + 1) >> 8;
          if (uVar12 < 0x80) {
LAB_0011555f:
            pcVar13 = "bad certificate message";
            iVar8 = 0x1116;
            goto LAB_001154de;
          }
          lVar17 = uVar16 + 3;
          uVar16 = (ulong)uVar12 + lVar17;
          if (ssl->in_hslen < uVar16) goto LAB_0011555f;
          iVar8 = mbedtls_x509_crt_parse_der
                            (ssl->session_negotiate->peer_cert,puVar5 + lVar17,(ulong)uVar12);
        } while ((iVar8 == -0x262e) || (iVar8 == 0));
        pcVar13 = " mbedtls_x509_crt_parse_der";
        iVar9 = 0x111e;
        goto LAB_001152de;
      }
      pcVar13 = "bad certificate message";
      iVar8 = 0x10f1;
      goto LAB_001154de;
    }
  }
  pcVar13 = "bad certificate message";
  iVar8 = 0x10e3;
LAB_001154de:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,iVar8,pcVar13);
  return -0x7a00;
}

Assistant:

int mbedtls_ssl_parse_certificate( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    int authmode = ssl->conf->authmode;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET )
        authmode = ssl->handshake->sni_authmode;
#endif

    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        authmode == MBEDTLS_SSL_VERIFY_NONE )
    {
        ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_SKIP_VERIFY;
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }
#endif

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    ssl->state++;

#if defined(MBEDTLS_SSL_SRV_C)
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    /*
     * Check if the client sent an empty certificate
     */
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_msglen  == 2                        &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_ALERT            &&
            ssl->in_msg[0]  == MBEDTLS_SSL_ALERT_LEVEL_WARNING  &&
            ssl->in_msg[1]  == MBEDTLS_SSL_ALERT_MSG_NO_CERT )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "SSLv3 client has no certificate" ) );

            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_SSL3 */

#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_hslen   == 3 + mbedtls_ssl_hs_hdr_len( ssl ) &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE    &&
            ssl->in_msg[0]  == MBEDTLS_SSL_HS_CERTIFICATE   &&
            memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ), "\0\0\0", 3 ) == 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLSv1 client has no certificate" ) );

            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
#endif /* MBEDTLS_SSL_SRV_C */

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE ||
        ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 3 + 3 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    i = mbedtls_ssl_hs_hdr_len( ssl );

    /*
     * Same message structure as in mbedtls_ssl_write_certificate()
     */
    n = ( ssl->in_msg[i+1] << 8 ) | ssl->in_msg[i+2];

    if( ssl->in_msg[i] != 0 ||
        ssl->in_hslen != n + 3 + mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    /* In case we tried to reuse a session but it failed */
    if( ssl->session_negotiate->peer_cert != NULL )
    {
        mbedtls_x509_crt_free( ssl->session_negotiate->peer_cert );
        mbedtls_free( ssl->session_negotiate->peer_cert );
    }

    if( ( ssl->session_negotiate->peer_cert = mbedtls_calloc( 1,
                    sizeof( mbedtls_x509_crt ) ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                       sizeof( mbedtls_x509_crt ) ) );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    mbedtls_x509_crt_init( ssl->session_negotiate->peer_cert );

    i += 3;

    while( i < ssl->in_hslen )
    {
        if( ssl->in_msg[i] != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        n = ( (unsigned int) ssl->in_msg[i + 1] << 8 )
            | (unsigned int) ssl->in_msg[i + 2];
        i += 3;

        if( n < 128 || i + n > ssl->in_hslen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        ret = mbedtls_x509_crt_parse_der( ssl->session_negotiate->peer_cert,
                                  ssl->in_msg + i, n );
        if( 0 != ret && ( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG + MBEDTLS_ERR_OID_NOT_FOUND ) != ret )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, " mbedtls_x509_crt_parse_der", ret );
            return( ret );
        }

        i += n;
    }

    MBEDTLS_SSL_DEBUG_CRT( 3, "peer certificate", ssl->session_negotiate->peer_cert );

    /*
     * On client, make sure the server cert doesn't change during renego to
     * avoid "triple handshake" attack: https://secure-resumption.com/
     */
#if defined(MBEDTLS_SSL_RENEGOTIATION) && defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
    {
        if( ssl->session->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "new server cert during renegotiation" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        if( ssl->session->peer_cert->raw.len !=
            ssl->session_negotiate->peer_cert->raw.len ||
            memcmp( ssl->session->peer_cert->raw.p,
                    ssl->session_negotiate->peer_cert->raw.p,
                    ssl->session->peer_cert->raw.len ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "server cert changed during renegotiation" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_RENEGOTIATION && MBEDTLS_SSL_CLI_C */

    if( authmode != MBEDTLS_SSL_VERIFY_NONE )
    {
        mbedtls_x509_crt *ca_chain;
        mbedtls_x509_crl *ca_crl;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
        if( ssl->handshake->sni_ca_chain != NULL )
        {
            ca_chain = ssl->handshake->sni_ca_chain;
            ca_crl   = ssl->handshake->sni_ca_crl;
        }
        else
#endif
        {
            ca_chain = ssl->conf->ca_chain;
            ca_crl   = ssl->conf->ca_crl;
        }

        if( ca_chain == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no CA chain" ) );
            return( MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED );
        }

        /*
         * Main check: verify certificate
         */
        ret = mbedtls_x509_crt_verify_with_profile(
                                ssl->session_negotiate->peer_cert,
                                ca_chain, ca_crl,
                                ssl->conf->cert_profile,
                                ssl->hostname,
                               &ssl->session_negotiate->verify_result,
                                ssl->conf->f_vrfy, ssl->conf->p_vrfy );

        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "x509_verify_cert", ret );
        }

        /*
         * Secondary checks: always done, but change 'ret' only if it was 0
         */

#if defined(MBEDTLS_ECP_C)
        {
            const mbedtls_pk_context *pk = &ssl->session_negotiate->peer_cert->pk;

            /* If certificate uses an EC key, make sure the curve is OK */
            if( mbedtls_pk_can_do( pk, MBEDTLS_PK_ECKEY ) &&
                mbedtls_ssl_check_curve( ssl, mbedtls_pk_ec( *pk )->grp.id ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (EC key curve)" ) );
                if( ret == 0 )
                    ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
            }
        }
#endif /* MBEDTLS_ECP_C */

        if( mbedtls_ssl_check_cert_usage( ssl->session_negotiate->peer_cert,
                                  ciphersuite_info,
                                  ! ssl->conf->endpoint,
                                 &ssl->session_negotiate->verify_result ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (usage extensions)" ) );
            if( ret == 0 )
                ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
        }

        if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
            ret = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate" ) );

    return( ret );
}